

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void __thiscall
google::protobuf::SplitStringAllowEmpty
          (protobuf *this,StringPiece full,char *delim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  size_t sVar1;
  stringpiece_ssize_type sVar2;
  char *__s;
  size_type pos;
  StringPiece s;
  string local_70;
  StringPiece local_50;
  StringPiece local_40;
  
  __s = (char *)full.length_;
  local_40.length_ = (stringpiece_ssize_type)full.ptr_;
  pos = 0;
  local_40.ptr_ = (char *)this;
  while( true ) {
    if (__s == (char *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = strlen(__s);
    }
    s.length_ = sVar1;
    s.ptr_ = __s;
    sVar2 = StringPiece::find_first_of(&local_40,s,pos);
    if (sVar2 == -1) break;
    local_50 = StringPiece::substr(&local_40,pos,sVar2 - pos);
    StringPiece::ToString_abi_cxx11_(&local_70,&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,&local_70)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pos = sVar2 + 1;
  }
  local_50 = StringPiece::substr(&local_40,pos,0xffffffffffffffff);
  StringPiece::ToString_abi_cxx11_(&local_70,&local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SplitStringAllowEmpty(StringPiece full, const char *delim,
                           std::vector<std::string> *result) {
  std::back_insert_iterator<std::vector<std::string> > it(*result);
  SplitStringToIteratorAllowEmpty(full, delim, 0, it);
}